

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O3

bool GGUFMeta::GKV<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::validate_override(llama_model_kv_override_type expected_type,llama_model_kv_override *ovrd)

{
  llama_model_kv_override_type lVar1;
  runtime_error *this;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  string local_40;
  
  if (ovrd == (llama_model_kv_override *)0x0) {
    bVar3 = false;
  }
  else {
    lVar1 = ovrd->tag;
    if (lVar1 == expected_type) {
      if (expected_type < 4) {
        pcVar2 = *(char **)(&DAT_00286058 + (ulong)expected_type * 8);
      }
      else {
        pcVar2 = "unknown";
      }
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: Using metadata override (%5s) \'%s\' = ",
                         "validate_override",pcVar2,ovrd->key);
      switch(ovrd->tag) {
      case LLAMA_KV_OVERRIDE_TYPE_INT:
        pcVar2 = (char *)(ovrd->field_2).val_i64;
        pcVar4 = "%ld\n";
        break;
      case LLAMA_KV_OVERRIDE_TYPE_FLOAT:
        llama_log_internal(GGML_LOG_LEVEL_INFO,"%.6f\n",(ovrd->field_2).val_i64);
        return true;
      case LLAMA_KV_OVERRIDE_TYPE_BOOL:
        pcVar2 = "false";
        if ((ovrd->field_2).val_bool != false) {
          pcVar2 = "true";
        }
        pcVar4 = "%s\n";
        break;
      case LLAMA_KV_OVERRIDE_TYPE_STR:
        pcVar2 = (char *)&ovrd->field_2;
        pcVar4 = "%s\n";
        break;
      default:
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        if ((ulong)ovrd->tag < 4) {
          pcVar2 = *(char **)(&DAT_00286058 + (ulong)ovrd->tag * 8);
        }
        else {
          pcVar2 = "unknown";
        }
        format_abi_cxx11_(&local_40,"Unsupported attempt to override %s type for metadata key %s\n",
                          pcVar2,ovrd->key);
        std::runtime_error::runtime_error(this,(string *)&local_40);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      llama_log_internal(GGML_LOG_LEVEL_INFO,pcVar4,pcVar2);
      bVar3 = true;
    }
    else {
      pcVar4 = "unknown";
      pcVar2 = "unknown";
      if (expected_type < 4) {
        pcVar2 = *(char **)(&DAT_00286058 + (ulong)expected_type * 8);
      }
      if (lVar1 < 4) {
        pcVar4 = *(char **)(&DAT_00286058 + (ulong)lVar1 * 8);
      }
      bVar3 = false;
      llama_log_internal(GGML_LOG_LEVEL_WARN,
                         "%s: Warning: Bad metadata override type for key \'%s\', expected %s but got %s\n"
                         ,"validate_override",ovrd->key,pcVar2,pcVar4);
    }
  }
  return bVar3;
}

Assistant:

static bool validate_override(const llama_model_kv_override_type expected_type, const struct llama_model_kv_override * ovrd) {
            if (!ovrd) { return false; }
            if (ovrd->tag == expected_type) {
                LLAMA_LOG_INFO("%s: Using metadata override (%5s) '%s' = ",
                    __func__, override_type_to_str(ovrd->tag), ovrd->key);
                switch (ovrd->tag) {
                    case LLAMA_KV_OVERRIDE_TYPE_BOOL:  {
                        LLAMA_LOG_INFO("%s\n", ovrd->val_bool ? "true" : "false");
                    } break;
                    case LLAMA_KV_OVERRIDE_TYPE_INT:   {
                        LLAMA_LOG_INFO("%" PRId64 "\n", ovrd->val_i64);
                    } break;
                    case LLAMA_KV_OVERRIDE_TYPE_FLOAT: {
                        LLAMA_LOG_INFO("%.6f\n", ovrd->val_f64);
                    } break;
                    case LLAMA_KV_OVERRIDE_TYPE_STR: {
                        LLAMA_LOG_INFO("%s\n", ovrd->val_str);
                    } break;
                    default:
                        // Shouldn't be possible to end up here, but just in case...
                        throw std::runtime_error(
                            format("Unsupported attempt to override %s type for metadata key %s\n",
                                override_type_to_str(ovrd->tag), ovrd->key));
                }
                return true;
            }
            LLAMA_LOG_WARN("%s: Warning: Bad metadata override type for key '%s', expected %s but got %s\n",
                __func__, ovrd->key, override_type_to_str(expected_type), override_type_to_str(ovrd->tag));
            return false;
        }